

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void __thiscall Portal::setup(Portal *this,Spritesheet *spritesheet,int height)

{
  reference pvVar1;
  int height_local;
  Spritesheet *spritesheet_local;
  Portal *this_local;
  
  if ((this->flipVertically & 1U) == 0) {
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x32);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x33);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x34);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x35);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x36);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x37);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x38);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x39);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x3a);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    (this->super_AABB).center.field_0.field_0.y = (float)height - 32.0;
  }
  else {
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x29);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2a);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2b);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2c);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2d);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2e);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x2f);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x30);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                       (&spritesheet->sprites,0x31);
    std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::push_back
              (&(this->animation).frames,pvVar1);
    (this->super_AABB).center.field_0.field_0.y = 32.0;
  }
  (this->animation).millisPerFrame = 0x32;
  return;
}

Assistant:

void Portal::setup(piksel::Spritesheet& spritesheet, int height) {
    if (flipVertically) {
        animation.frames.push_back(spritesheet.sprites[41]);
        animation.frames.push_back(spritesheet.sprites[42]);
        animation.frames.push_back(spritesheet.sprites[43]);
        animation.frames.push_back(spritesheet.sprites[44]);
        animation.frames.push_back(spritesheet.sprites[45]);
        animation.frames.push_back(spritesheet.sprites[46]);
        animation.frames.push_back(spritesheet.sprites[47]);
        animation.frames.push_back(spritesheet.sprites[48]);
        animation.frames.push_back(spritesheet.sprites[49]);

        center.y = 32.0f;
    } else {
        animation.frames.push_back(spritesheet.sprites[50]);
        animation.frames.push_back(spritesheet.sprites[51]);
        animation.frames.push_back(spritesheet.sprites[52]);
        animation.frames.push_back(spritesheet.sprites[53]);
        animation.frames.push_back(spritesheet.sprites[54]);
        animation.frames.push_back(spritesheet.sprites[55]);
        animation.frames.push_back(spritesheet.sprites[56]);
        animation.frames.push_back(spritesheet.sprites[57]);
        animation.frames.push_back(spritesheet.sprites[58]);

        center.y = height - PORTAL_HEIGHT / 2.0f;
    }

    animation.millisPerFrame = 50;
}